

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O0

ggml_tensor * __thiscall
llm_graph_context::build_ffn
          (llm_graph_context *this,ggml_tensor *cur,ggml_tensor *up,ggml_tensor *up_b,
          ggml_tensor *up_s,ggml_tensor *gate,ggml_tensor *gate_b,ggml_tensor *gate_s,
          ggml_tensor *down,ggml_tensor *down_b,ggml_tensor *down_s,ggml_tensor *act_scales,
          llm_ffn_op_type type_op,llm_ffn_gate_type type_gate,int il)

{
  ggml_tensor *pgVar1;
  int64_t iVar2;
  size_t sVar3;
  ggml_tensor *pgVar4;
  undefined8 uVar5;
  long lVar6;
  undefined8 uVar7;
  long in_RCX;
  long in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *in_RDI;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  long in_stack_00000028;
  long in_stack_00000030;
  undefined4 in_stack_00000038;
  int in_stack_00000040;
  ggml_tensor *x1;
  ggml_tensor *x0;
  int64_t split_point;
  ggml_tensor *tmp;
  int in_stack_ffffffffffffff4c;
  ggml_tensor *in_stack_ffffffffffffff50;
  ggml_tensor *in_stack_ffffffffffffff58;
  ggml_tensor *in_stack_ffffffffffffff60;
  ggml_tensor *in_stack_ffffffffffffffa0;
  ggml_tensor *cur_00;
  llm_graph_context *in_stack_ffffffffffffffb0;
  ggml_tensor *local_38;
  ggml_tensor *local_10;
  
  local_38 = in_RSI;
  if (in_RDX != 0) {
    local_38 = build_lora_mm(in_stack_ffffffffffffffb0,in_RDI,in_stack_ffffffffffffffa0);
  }
  cur_00 = local_38;
  cb((llm_graph_context *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
     (char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  if (in_RCX != 0) {
    local_38 = (ggml_tensor *)ggml_add(in_RDI->src[5],local_38,in_RCX);
    cb((llm_graph_context *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
       (char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  }
  if (in_R8 != 0) {
    local_38 = (ggml_tensor *)ggml_mul(in_RDI->src[5],local_38,in_R8);
    cb((llm_graph_context *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
       (char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  }
  if (in_R9 == 0) {
    local_10 = local_38;
  }
  else {
    if (in_stack_00000040 == 0) {
      local_10 = build_lora_mm(in_stack_ffffffffffffffb0,in_RDI,cur_00);
      cb((llm_graph_context *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
         (char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    }
    else {
      local_10 = in_RSI;
      if (in_stack_00000040 == 1) {
        local_10 = build_lora_mm(in_stack_ffffffffffffffb0,in_RDI,cur_00);
        cb((llm_graph_context *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
           (char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      }
    }
    if (in_stack_00000008 != 0) {
      local_10 = (ggml_tensor *)ggml_add(in_RDI->src[5],local_10,in_stack_00000008);
      cb((llm_graph_context *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
         (char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    }
    if (in_stack_00000010 != 0) {
      local_10 = (ggml_tensor *)ggml_mul(in_RDI->src[5],local_10,in_stack_00000010);
      cb((llm_graph_context *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
         (char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    }
  }
  switch(in_stack_00000038) {
  case 0:
    local_10 = (ggml_tensor *)ggml_silu(in_RDI->src[5],local_10);
    cb((llm_graph_context *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
       (char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    break;
  case 1:
    local_10 = (ggml_tensor *)ggml_gelu(in_RDI->src[5],local_10);
    cb((llm_graph_context *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
       (char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    if (in_stack_00000030 != 0) {
      local_10 = (ggml_tensor *)ggml_div(in_RDI->src[5],local_10,in_stack_00000030);
      cb((llm_graph_context *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
         (char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    }
    break;
  case 2:
    local_10 = (ggml_tensor *)ggml_relu(in_RDI->src[5],local_10);
    cb((llm_graph_context *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
       (char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    break;
  case 3:
    uVar5 = ggml_relu(in_RDI->src[5],local_10);
    cb((llm_graph_context *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
       (char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    local_10 = (ggml_tensor *)ggml_sqr(in_RDI->src[5],uVar5);
    cb((llm_graph_context *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
       (char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    break;
  case 4:
    pgVar4 = (ggml_tensor *)(local_10->ne[0] / 2);
    in_stack_ffffffffffffff50 = in_RDI->src[5];
    uVar5 = ggml_view_2d(in_RDI->src[5],local_10,pgVar4,local_10->ne[1],local_10->nb[1],0);
    uVar5 = ggml_cont(in_stack_ffffffffffffff50,uVar5);
    pgVar1 = in_RDI->src[5];
    in_stack_ffffffffffffff60 = in_RDI->src[5];
    iVar2 = local_10->ne[1];
    sVar3 = local_10->nb[1];
    in_stack_ffffffffffffff58 = pgVar4;
    lVar6 = ggml_element_size(local_10);
    uVar7 = ggml_view_2d(in_stack_ffffffffffffff60,local_10,pgVar4,iVar2,sVar3,
                         (long)in_stack_ffffffffffffff58 * lVar6);
    in_stack_ffffffffffffffb0 = (llm_graph_context *)ggml_cont(pgVar1,uVar7);
    uVar5 = ggml_silu(in_RDI->src[5],uVar5);
    cb((llm_graph_context *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
       (char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    local_10 = (ggml_tensor *)ggml_mul(in_RDI->src[5],uVar5,in_stack_ffffffffffffffb0);
    cb((llm_graph_context *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
       (char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  }
  if (in_stack_00000040 == 1) {
    local_10 = (ggml_tensor *)ggml_mul(in_RDI->src[5],local_10,local_38);
    cb((llm_graph_context *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
       (char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  }
  if ((in_stack_00000018 != 0) &&
     (local_10 = build_lora_mm(in_stack_ffffffffffffffb0,in_RDI,cur_00), in_RDI->type == 0x31)) {
    ggml_mul_mat_set_prec(local_10,1);
  }
  if (in_stack_00000020 != 0) {
    cb((llm_graph_context *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
       (char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    local_10 = (ggml_tensor *)ggml_add(in_RDI->src[5],local_10,in_stack_00000020);
  }
  if (in_stack_00000028 != 0) {
    local_10 = (ggml_tensor *)ggml_mul(in_RDI->src[5],local_10,in_stack_00000028);
    cb((llm_graph_context *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
       (char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  }
  return local_10;
}

Assistant:

ggml_tensor * llm_graph_context::build_ffn(
         ggml_tensor * cur,
         ggml_tensor * up,
         ggml_tensor * up_b,
         ggml_tensor * up_s,
         ggml_tensor * gate,
         ggml_tensor * gate_b,
         ggml_tensor * gate_s,
         ggml_tensor * down,
         ggml_tensor * down_b,
         ggml_tensor * down_s,
         ggml_tensor * act_scales,
     llm_ffn_op_type   type_op,
   llm_ffn_gate_type   type_gate,
                 int   il) const {
    ggml_tensor * tmp = up ? build_lora_mm(up, cur) : cur;
    cb(tmp, "ffn_up", il);

    if (up_b) {
        tmp = ggml_add(ctx0, tmp, up_b);
        cb(tmp, "ffn_up_b", il);
    }

    if (up_s) {
        tmp = ggml_mul(ctx0, tmp, up_s);
        cb(tmp, "ffn_up_s", il);
    }

    if (gate) {
        switch (type_gate) {
            case LLM_FFN_SEQ:
                {
                    cur = build_lora_mm(gate, tmp);
                    cb(cur, "ffn_gate", il);
                } break;
            case LLM_FFN_PAR:
                {
                    cur = build_lora_mm(gate, cur);
                    cb(cur, "ffn_gate", il);
                } break;
        }

        if (gate_b) {
            cur = ggml_add(ctx0, cur, gate_b);
            cb(cur, "ffn_gate_b", il);
        }

        if (gate_s) {
            cur = ggml_mul(ctx0, cur, gate_s);
            cb(cur, "ffn_gate_s", il);
        }

    } else {
        cur = tmp;
    }

    switch (type_op) {
        case LLM_FFN_SILU:
            {
                cur = ggml_silu(ctx0, cur);
                cb(cur, "ffn_silu", il);
            } break;
        case LLM_FFN_GELU:
            {
                cur = ggml_gelu(ctx0, cur);
                cb(cur, "ffn_gelu", il);
                if (act_scales != NULL) {
                    cur = ggml_div(ctx0, cur, act_scales);
                    cb(cur, "ffn_act", il);
                }
            } break;
        case LLM_FFN_RELU:
            {
                cur = ggml_relu(ctx0, cur);
                cb(cur, "ffn_relu", il);
            } break;
        case LLM_FFN_RELU_SQR:
            {
                cur = ggml_relu(ctx0, cur);
                cb(cur, "ffn_relu", il);

                cur = ggml_sqr(ctx0, cur);
                cb(cur, "ffn_sqr(relu)", il);
            } break;
        case LLM_FFN_SWIGLU:
            {
                // Project to 4h. If using swiglu double the output width, see https://arxiv.org/pdf/2002.05202.pdf
                int64_t split_point = cur->ne[0] / 2;
                ggml_tensor * x0 = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, split_point, cur->ne[1], cur->nb[1], 0));
                ggml_tensor * x1 = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, split_point, cur->ne[1], cur->nb[1], split_point * ggml_element_size(cur)));

                x0 = ggml_silu(ctx0, x0);
                cb(cur, "ffn_silu", il);

                cur = ggml_mul(ctx0, x0, x1);
                cb(cur, "ffn_mul", il);
            } break;
    }

    if (type_gate == LLM_FFN_PAR) {
        cur = ggml_mul(ctx0, cur, tmp);
        cb(cur, "ffn_gate_par", il);
    }

    if (down) {
        cur = build_lora_mm(down, cur);
        if (arch == LLM_ARCH_GLM4) {
            // GLM4 seems to have numerical issues with half-precision accumulators
            ggml_mul_mat_set_prec(cur, GGML_PREC_F32);
        }
    }

    if (down_b) {
        cb(cur, "ffn_down", il);
    }

    if (down_b) {
        cur = ggml_add(ctx0, cur, down_b);
    }

    if (down_s) {
        cur = ggml_mul(ctx0, cur, down_s);
        cb(cur, "ffn_down_s", il);
    }

    return cur;
}